

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_set.h
# Opt level: O2

size_t __thiscall
wasm::
SmallSetBase<wasm::HeapType,_5UL,_wasm::UnorderedFixedStorage<wasm::HeapType,_5UL>,_std::unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>_>
::count(SmallSetBase<wasm::HeapType,_5UL,_wasm::UnorderedFixedStorage<wasm::HeapType,_5UL>,_std::unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>_>
        *this,HeapType *x)

{
  ulong uVar1;
  ulong uVar2;
  size_type sVar3;
  ulong uVar4;
  
  if ((this->flexible)._M_h._M_element_count != 0) {
    sVar3 = std::
            _Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
            ::count(&(this->flexible)._M_h,x);
    return sVar3;
  }
  uVar1 = (this->fixed).super_FixedStorageBase<wasm::HeapType,_5UL>.used;
  uVar2 = 0;
  do {
    uVar4 = uVar2;
    if (uVar1 == uVar4) break;
    uVar2 = uVar4 + 1;
  } while ((this->fixed).super_FixedStorageBase<wasm::HeapType,_5UL>.storage._M_elems[uVar4].id !=
           x->id);
  return (ulong)(uVar4 < uVar1);
}

Assistant:

size_t count(const T& x) const {
    if (usingFixed()) {
      // Do a linear search.
      for (size_t i = 0; i < fixed.used; i++) {
        if (fixed.storage[i] == x) {
          return 1;
        }
      }
      return 0;
    } else {
      return flexible.count(x);
    }
  }